

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O3

gdImagePtr gdImageCreateFromTga(FILE *fp)

{
  gdIOCtx *ctx;
  gdImagePtr pgVar1;
  
  ctx = gdNewFileCtx(fp);
  if (ctx == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromTgaCtx(ctx);
    (*ctx->gd_free)(ctx);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTga(FILE *fp)
{
	gdImagePtr image;
	gdIOCtx* in = gdNewFileCtx(fp);
	if (in == NULL) return NULL;
	image = gdImageCreateFromTgaCtx(in);
	in->gd_free( in );
	return image;
}